

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O0

void MRIStepCoupling_Space(MRIStepCoupling MRIC,sunindextype *liw,sunindextype *lrw)

{
  sunindextype *lrw_local;
  sunindextype *liw_local;
  MRIStepCoupling MRIC_local;
  
  *liw = 0;
  *lrw = 0;
  if (MRIC != (MRIStepCoupling)0x0) {
    *liw = 4;
    if (MRIC->c != (sunrealtype *)0x0) {
      *lrw = (long)MRIC->stages + *lrw;
    }
    if (MRIC->W != (sunrealtype ***)0x0) {
      *lrw = (long)(MRIC->nmat * MRIC->stages * MRIC->stages) + *lrw;
    }
    if (MRIC->G != (sunrealtype ***)0x0) {
      *lrw = (long)(MRIC->nmat * MRIC->stages * MRIC->stages) + *lrw;
    }
  }
  return;
}

Assistant:

void MRIStepCoupling_Space(MRIStepCoupling MRIC, sunindextype* liw,
                           sunindextype* lrw)
{
  /* initialize outputs and return if MRIC is not allocated */
  *liw = 0;
  *lrw = 0;
  if (!MRIC) { return; }

  /* fill outputs based on MRIC */
  *liw = 4;
  if (MRIC->c) { *lrw += MRIC->stages; }
  if (MRIC->W) { *lrw += MRIC->nmat * MRIC->stages * MRIC->stages; }
  if (MRIC->G) { *lrw += MRIC->nmat * MRIC->stages * MRIC->stages; }
}